

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O0

void Jf_ManFree(Jf_Man_t *p)

{
  uint uVar1;
  abctime aVar2;
  double dVar3;
  Jf_Man_t *p_local;
  
  if ((p->pPars->fVerbose != 0) && (p->pDsd != (Sdm_Man_t *)0x0)) {
    Sdm_ManPrintDsdStats(p->pDsd,0);
  }
  if ((p->pPars->fVerbose != 0) && (p->vTtMem != (Vec_Mem_t *)0x0)) {
    uVar1 = Vec_MemEntryNum(p->vTtMem);
    dVar3 = Vec_MemMemory(p->vTtMem);
    printf("Unique truth tables = %d. Memory = %.2f MB   ",dVar3 / 1048576.0,(ulong)uVar1);
    aVar2 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar2 - p->clkStart);
  }
  if (((p->pPars->fVeryVerbose != 0) && (p->pPars->fCutMin != 0)) && (p->pPars->fFuncDsd != 0)) {
    Jf_ManProfileClasses(p);
  }
  if (p->pPars->fCoarsen != 0) {
    Gia_ManCleanMark0(p->pGia);
  }
  if (p->pGia->pRefs != (int *)0x0) {
    free(p->pGia->pRefs);
    p->pGia->pRefs = (int *)0x0;
  }
  if ((p->vCuts).pArray != (int *)0x0) {
    free((p->vCuts).pArray);
    (p->vCuts).pArray = (int *)0x0;
  }
  if ((p->vArr).pArray != (int *)0x0) {
    free((p->vArr).pArray);
    (p->vArr).pArray = (int *)0x0;
  }
  if ((p->vDep).pArray != (int *)0x0) {
    free((p->vDep).pArray);
    (p->vDep).pArray = (int *)0x0;
  }
  if ((p->vFlow).pArray != (float *)0x0) {
    free((p->vFlow).pArray);
    (p->vFlow).pArray = (float *)0x0;
  }
  if ((p->vRefs).pArray != (float *)0x0) {
    free((p->vRefs).pArray);
    (p->vRefs).pArray = (float *)0x0;
  }
  if ((p->pPars->fCutMin != 0) && (p->pPars->fFuncDsd == 0)) {
    Vec_MemHashFree(p->vTtMem);
    Vec_MemFree(p->vTtMem);
  }
  Vec_IntFreeP(&p->vCnfs);
  Vec_SetFree_(&p->pMem);
  Vec_IntFreeP(&p->vTemp);
  if (p != (Jf_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Jf_ManFree( Jf_Man_t * p )
{
    if ( p->pPars->fVerbose && p->pDsd )
        Sdm_ManPrintDsdStats( p->pDsd, 0 );
    if ( p->pPars->fVerbose && p->vTtMem )
    {
        printf( "Unique truth tables = %d. Memory = %.2f MB   ", Vec_MemEntryNum(p->vTtMem), Vec_MemMemory(p->vTtMem) / (1<<20) ); 
        Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
    }
    if ( p->pPars->fVeryVerbose && p->pPars->fCutMin && p->pPars->fFuncDsd )
        Jf_ManProfileClasses( p );
    if ( p->pPars->fCoarsen )
        Gia_ManCleanMark0( p->pGia );
    ABC_FREE( p->pGia->pRefs );
    ABC_FREE( p->vCuts.pArray );
    ABC_FREE( p->vArr.pArray );
    ABC_FREE( p->vDep.pArray );
    ABC_FREE( p->vFlow.pArray );
    ABC_FREE( p->vRefs.pArray );
    if ( p->pPars->fCutMin && !p->pPars->fFuncDsd )
    {
        Vec_MemHashFree( p->vTtMem );
        Vec_MemFree( p->vTtMem );
    }
    Vec_IntFreeP( &p->vCnfs );
    Vec_SetFree_( &p->pMem );
    Vec_IntFreeP( &p->vTemp );
    ABC_FREE( p );
}